

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

void SUNDlsMat_AddIdentity(SUNDlsMat A)

{
  long lVar1;
  long lVar2;
  
  if (A->type == 1) {
    lVar2 = 0;
    lVar1 = A->N;
    if (A->N < 1) {
      lVar1 = lVar2;
    }
    for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      A->cols[lVar2][lVar2] = A->cols[lVar2][lVar2] + 1.0;
    }
  }
  else if (A->type == 2) {
    lVar2 = 0;
    lVar1 = A->M;
    if (A->M < 1) {
      lVar1 = lVar2;
    }
    for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      A->cols[lVar2][A->s_mu] = A->cols[lVar2][A->s_mu] + 1.0;
    }
  }
  return;
}

Assistant:

void SUNDlsMat_AddIdentity(SUNDlsMat A)
{
  sunindextype i;

  switch (A->type)
  {
  case SUNDIALS_DENSE:
    for (i = 0; i < A->N; i++) { A->cols[i][i] += ONE; }
    break;

  case SUNDIALS_BAND:
    for (i = 0; i < A->M; i++) { A->cols[i][A->s_mu] += ONE; }
    break;
  }
}